

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processMemberTypeDefinitions
          (PSVIWriterHandlers *this,XSSimpleTypeDefinitionList *memberTypes)

{
  XMLSize_t XVar1;
  XSSimpleTypeDefinition *type;
  uint local_1c;
  uint i;
  XSSimpleTypeDefinitionList *memberTypes_local;
  PSVIWriterHandlers *this_local;
  
  if (memberTypes == (XSSimpleTypeDefinitionList *)0x0) {
    sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinitions);
  }
  else {
    sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinitions);
    local_1c = 0;
    while( true ) {
      XVar1 = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition>::size
                        ((BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)memberTypes);
      if (XVar1 <= local_1c) break;
      type = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition>::elementAt
                       ((BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)memberTypes,
                        (ulong)local_1c);
      processTypeDefinitionOrRef
                (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinition,
                 (XSTypeDefinition *)type);
      local_1c = local_1c + 1;
    }
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinitions);
  }
  return;
}

Assistant:

void PSVIWriterHandlers::processMemberTypeDefinitions(XSSimpleTypeDefinitionList* memberTypes) {
	if (memberTypes == NULL) {
		sendElementEmpty(PSVIUni::fgMemberTypeDefinitions);
	} else {
		sendIndentedElement(PSVIUni::fgMemberTypeDefinitions);
		for (unsigned int i = 0; i < memberTypes->size(); i++) {
			processTypeDefinitionOrRef(PSVIUni::fgMemberTypeDefinition, (XSTypeDefinition*)memberTypes->elementAt(i));
		}
		sendUnindentedElement(PSVIUni::fgMemberTypeDefinitions);
	}
}